

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O2

void __thiscall CConsole::RegisterTempMap(CConsole *this,char *pName)

{
  CMapListEntryTemp *pCVar1;
  CHeap *this_00;
  CMapListEntryTemp *pCVar2;
  
  this_00 = this->m_pTempMapListHeap;
  if (this_00 == (CHeap *)0x0) {
    this_00 = (CHeap *)operator_new(8);
    CHeap::CHeap(this_00);
    this->m_pTempMapListHeap = this_00;
  }
  pCVar2 = (CMapListEntryTemp *)CHeap::Allocate(this_00,0x30);
  pCVar2->m_pNext = (CMapListEntryTemp *)0x0;
  pCVar1 = this->m_pLastMapEntry;
  pCVar2->m_pPrev = pCVar1;
  if (pCVar1 != (CMapListEntryTemp *)0x0) {
    pCVar1->m_pNext = pCVar2;
  }
  this->m_pLastMapEntry = pCVar2;
  if (this->m_pFirstMapEntry == (CMapListEntryTemp *)0x0) {
    this->m_pFirstMapEntry = pCVar2;
  }
  str_copy(pCVar2->m_aName,pName,0x20);
  return;
}

Assistant:

void CConsole::RegisterTempMap(const char *pName)
{
	if(!m_pTempMapListHeap)
		m_pTempMapListHeap = new CHeap();
	CMapListEntryTemp *pEntry = (CMapListEntryTemp *)m_pTempMapListHeap->Allocate(sizeof(CMapListEntryTemp));
	pEntry->m_pNext = 0;
	pEntry->m_pPrev = m_pLastMapEntry;
	if(pEntry->m_pPrev)
		pEntry->m_pPrev->m_pNext = pEntry;
	m_pLastMapEntry = pEntry;
	if(!m_pFirstMapEntry)
		m_pFirstMapEntry = pEntry;
	str_copy(pEntry->m_aName, pName, TEMPMAP_NAME_LENGTH);
}